

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O1

bool __thiscall
slang::ast::BinaryExpression::propagateType
          (BinaryExpression *this,ASTContext *context,Type *newType,SourceRange propRange,
          ConversionKind param_4)

{
  SourceRange opRange;
  SourceRange opRange_00;
  SourceRange opRange_01;
  bool bVar1;
  undefined8 in_RAX;
  Diagnostic *diag;
  SourceLocation newType_00;
  SourceLocation unaff_RBX;
  bool bVar2;
  ConversionKind conversionKind;
  undefined4 uVar3;
  
  newType_00 = propRange.startLoc;
  uVar3 = (undefined4)((ulong)in_RAX >> 0x20);
  bVar2 = false;
  if ((0x7ffe00U >> (this->op & (LogicalShiftRight|BinaryXor)) & 1) == 0) {
    conversionKind = propRange.endLoc._0_4_;
    if ((0x1ffU >> (this->op & (LogicalShiftRight|BinaryXor)) & 1) == 0) {
      (this->super_Expression).type.ptr = newType;
      opRange_01.startLoc._4_4_ = uVar3;
      opRange_01.startLoc._0_4_ = 1;
      opRange_01.endLoc = unaff_RBX;
      Expression::contextDetermined
                ((Expression *)context,(ASTContext *)&this->left_,(Expression **)this,
                 (Expression *)newType,(Type *)newType_00,opRange_01,conversionKind);
      bVar2 = true;
      if (this->op == ArithmeticShiftRight) {
        bVar1 = Type::isSigned((this->super_Expression).type.ptr);
        if (!bVar1) {
          diag = ASTContext::addDiag(context,(DiagCode)0xd70007,this->left_->sourceRange);
          ast::operator<<(diag,(this->super_Expression).type.ptr);
        }
      }
    }
    else {
      (this->super_Expression).type.ptr = newType;
      opRange.startLoc._4_4_ = uVar3;
      opRange.startLoc._0_4_ = 1;
      opRange.endLoc = unaff_RBX;
      Expression::contextDetermined
                ((Expression *)context,(ASTContext *)&this->left_,(Expression **)this,
                 (Expression *)newType,(Type *)newType_00,opRange,conversionKind);
      opRange_00.startLoc._4_4_ = uVar3;
      opRange_00.startLoc._0_4_ = 1;
      opRange_00.endLoc = unaff_RBX;
      Expression::contextDetermined
                ((Expression *)context,(ASTContext *)&this->right_,(Expression **)this,
                 (Expression *)newType,(Type *)newType_00,opRange_00,conversionKind);
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool BinaryExpression::propagateType(const ASTContext& context, const Type& newType,
                                     SourceRange propRange, ConversionKind) {
    switch (op) {
        case BinaryOperator::Add:
        case BinaryOperator::Subtract:
        case BinaryOperator::Multiply:
        case BinaryOperator::Divide:
        case BinaryOperator::Mod:
        case BinaryOperator::BinaryAnd:
        case BinaryOperator::BinaryOr:
        case BinaryOperator::BinaryXor:
        case BinaryOperator::BinaryXnor:
            type = &newType;
            contextDetermined(context, left_, this, newType, propRange);
            contextDetermined(context, right_, this, newType, propRange);
            return true;
        case BinaryOperator::Equality:
        case BinaryOperator::Inequality:
        case BinaryOperator::CaseEquality:
        case BinaryOperator::CaseInequality:
        case BinaryOperator::GreaterThanEqual:
        case BinaryOperator::GreaterThan:
        case BinaryOperator::LessThanEqual:
        case BinaryOperator::LessThan:
        case BinaryOperator::WildcardEquality:
        case BinaryOperator::WildcardInequality:
        case BinaryOperator::LogicalAnd:
        case BinaryOperator::LogicalOr:
        case BinaryOperator::LogicalImplication:
        case BinaryOperator::LogicalEquivalence:
            // Type is already set (always 1 bit) and operands are already folded.
            return false;
        case BinaryOperator::LogicalShiftLeft:
        case BinaryOperator::LogicalShiftRight:
        case BinaryOperator::ArithmeticShiftLeft:
        case BinaryOperator::ArithmeticShiftRight:
        case BinaryOperator::Power:
            // Only the left hand side gets propagated; the rhs is self determined.
            type = &newType;
            contextDetermined(context, left_, this, newType, propRange);
            if (op == BinaryOperator::ArithmeticShiftRight && !type->isSigned())
                context.addDiag(diag::UnsignedArithShift, left_->sourceRange) << *type;
            return true;
    }
    SLANG_UNREACHABLE;
}